

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O1

int AF_A_KillChildren(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *origin;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  AActor *source;
  AActor *inflictor;
  AActor *killtarget;
  PClassActor *pPVar7;
  AActor *pAVar8;
  uint uVar9;
  VMValue *pVVar10;
  char *pcVar11;
  PClassActor *filter;
  int selector;
  bool bVar12;
  TThinkerIterator<AActor> it;
  int local_60;
  int local_5c;
  FName local_58;
  FName local_54;
  ulong local_50;
  FThinkerIterator local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar11 = "(paramnum) < numparam";
    goto LAB_0065daeb;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_0065daa1:
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0065daeb:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  pVVar10 = param;
  uVar9 = numparam;
  if (origin != (AActor *)0x0) {
    if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
      (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar6 = (origin->super_DThinker).super_DObject.Class;
    bVar12 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar12;
    uVar9 = (uint)bVar12;
    pVVar10 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar12);
    if (pPVar6 != pPVar3 && !bVar12) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      pcVar11 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0065daeb;
    }
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_0065daa1;
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar5 = (**(code **)*puVar2)(puVar2,pVVar10,uVar9,ret);
        puVar2[1] = uVar5;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar12 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar12) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar12 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (!bVar12) {
        pcVar11 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0065daeb;
      }
    }
  }
  if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
     ((VVar1 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    pcVar11 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_0065daeb;
  }
  local_5c = 0;
  local_60 = 0;
  if (3 < numparam) {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_60 = param[3].field_0.i;
    }
    else {
      local_60 = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x1968,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  if (4 < numparam) {
    VVar1 = param[4].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_5c = param[4].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1969,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  local_50 = 0;
  if ((5 < numparam) && (VVar1 = param[5].field_0.field_3.Type, VVar1 != 0xff)) {
    if ((VVar1 != '\x03') ||
       ((param[5].field_0.field_1.atag != 1 && (param[5].field_0.field_1.a != (void *)0x0)))) {
      pcVar11 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
LAB_0065dacc:
      __assert_fail(pcVar11,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196a,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    filter = (PClassActor *)param[5].field_0.field_1.a;
    if (filter != (PClassActor *)0x0) {
      pPVar7 = filter;
      if (filter != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
          if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar7 != (PClassActor *)0x0);
        if (pPVar7 == (PClassActor *)0x0) {
          pcVar11 = "filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_0065dacc;
        }
      }
      goto LAB_0065d925;
    }
  }
  filter = (PClassActor *)0x0;
LAB_0065d925:
  if (6 < numparam) {
    VVar1 = param[6].field_0.field_3.Type;
    if (VVar1 == '\0') {
      local_50 = (ulong)(uint)param[6].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196b,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  iVar4 = 0;
  if (7 < numparam) {
    VVar1 = param[7].field_0.field_3.Type;
    if (VVar1 == '\0') {
      iVar4 = param[7].field_0.i;
    }
    else if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196c,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  selector = 0;
  if (8 < numparam) {
    VVar1 = param[8].field_0.field_3.Type;
    if (VVar1 == '\0') {
      selector = param[8].field_0.i;
    }
    else {
      selector = 0;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x196d,
                      "int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  source = COPY_AAPTR(origin,iVar4);
  inflictor = COPY_AAPTR(origin,selector);
  FThinkerIterator::FThinkerIterator(&local_48,AActor::RegistrationInfo.MyClass,0x80);
  killtarget = (AActor *)FThinkerIterator::Next(&local_48);
  if (killtarget != (AActor *)0x0) {
    do {
      pAVar8 = (killtarget->master).field_0.p;
      if ((pAVar8 != (AActor *)0x0) &&
         (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (killtarget->master).field_0.p = (AActor *)0x0;
        pAVar8 = (AActor *)0x0;
      }
      if (pAVar8 == origin) {
        local_54.Index = local_60;
        local_58.Index = (int)local_50;
        DoKill(killtarget,inflictor,source,&local_54,local_5c,filter,&local_58);
      }
      killtarget = (AActor *)FThinkerIterator::Next(&local_48);
    } while (killtarget != (AActor *)0x0);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillChildren)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self) 
		{
			DoKill(mo, inflictor, source, damagetype, flags, filter, species);
		}
	}
	return 0;
}